

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sw_diag_avx2_256_16.c
# Opt level: O1

parasail_result_t *
parasail_sw_table_diag_avx2_256_16
          (char *_s1,int _s1Len,char *_s2,int s2Len,int open,int gap,parasail_matrix_t *matrix)

{
  int16_t iVar1;
  ushort uVar2;
  int *piVar3;
  int *piVar4;
  bool bVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  short sVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  uint uVar23;
  uint uVar24;
  uint uVar25;
  uint uVar26;
  uint uVar27;
  undefined4 uVar28;
  int iVar29;
  int iVar30;
  parasail_result_t *ppVar31;
  undefined1 (*ptr) [16];
  int16_t *ptr_00;
  int16_t *ptr_01;
  int16_t *ptr_02;
  long lVar32;
  ulong uVar33;
  uint uVar34;
  int iVar35;
  int iVar36;
  ulong uVar37;
  uint uVar38;
  ulong uVar39;
  int iVar40;
  uint uVar41;
  int iVar42;
  ulong uVar43;
  ulong uVar44;
  ulong uVar45;
  uint uVar46;
  ulong uVar47;
  uint uVar48;
  uint uVar49;
  uint uVar50;
  uint uVar51;
  uint uVar52;
  ulong uVar53;
  ulong uVar54;
  ulong uVar55;
  ulong uVar56;
  ulong uVar57;
  ulong uVar58;
  ulong uVar59;
  ulong uVar60;
  ulong uVar61;
  ulong uVar62;
  ulong uVar63;
  ulong uVar64;
  ulong uVar65;
  int16_t iVar66;
  undefined1 auVar67 [32];
  undefined1 auVar68 [64];
  undefined1 auVar69 [32];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  __m256i vMaxH;
  uint local_3a0;
  long local_340;
  long local_338;
  long local_330;
  long local_328;
  long local_320;
  long local_318;
  long local_310;
  long local_308;
  long local_300;
  long local_2f8;
  long local_2f0;
  long local_2e8;
  long local_2e0;
  long local_2d8;
  long local_2d0;
  long local_2c8;
  undefined1 local_2c0 [32];
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  short local_1a0;
  short sStack_19e;
  short sStack_19c;
  short sStack_19a;
  short sStack_198;
  short sStack_196;
  short sStack_194;
  short sStack_192;
  short sStack_190;
  short sStack_18e;
  short sStack_18c;
  short sStack_18a;
  short sStack_188;
  short sStack_186;
  short sStack_184;
  short sStack_182;
  undefined1 local_180 [32];
  undefined1 local_160 [32];
  undefined2 local_140;
  undefined2 uStack_13e;
  undefined2 uStack_13c;
  undefined2 uStack_13a;
  undefined2 uStack_138;
  undefined2 uStack_136;
  undefined2 uStack_134;
  undefined2 uStack_132;
  undefined2 uStack_130;
  undefined2 uStack_12e;
  undefined2 uStack_12c;
  undefined2 uStack_12a;
  undefined2 uStack_128;
  undefined2 uStack_126;
  undefined2 uStack_124;
  undefined2 uStack_122;
  undefined2 local_120;
  undefined2 uStack_11e;
  undefined2 uStack_11c;
  undefined2 uStack_11a;
  undefined2 uStack_118;
  undefined2 uStack_116;
  undefined2 uStack_114;
  undefined2 uStack_112;
  undefined2 uStack_110;
  undefined2 uStack_10e;
  undefined2 uStack_10c;
  undefined2 uStack_10a;
  undefined2 uStack_108;
  undefined2 uStack_106;
  undefined2 uStack_104;
  undefined2 uStack_102;
  undefined1 local_100 [32];
  undefined2 local_e0;
  undefined2 uStack_de;
  undefined2 uStack_dc;
  undefined2 uStack_da;
  undefined2 uStack_d8;
  undefined2 uStack_d6;
  undefined2 uStack_d4;
  undefined2 uStack_d2;
  undefined2 uStack_d0;
  undefined2 uStack_ce;
  undefined2 uStack_cc;
  undefined2 uStack_ca;
  undefined2 uStack_c8;
  undefined2 uStack_c6;
  undefined2 uStack_c4;
  undefined2 uStack_c2;
  undefined2 local_c0;
  undefined2 uStack_be;
  undefined2 uStack_bc;
  undefined2 uStack_ba;
  undefined2 uStack_b8;
  undefined2 uStack_b6;
  undefined2 uStack_b4;
  undefined2 uStack_b2;
  undefined2 uStack_b0;
  undefined2 uStack_ae;
  undefined2 uStack_ac;
  undefined2 uStack_aa;
  undefined2 uStack_a8;
  undefined2 uStack_a6;
  undefined2 uStack_a4;
  undefined2 uStack_a2;
  undefined2 local_a0;
  undefined2 uStack_9e;
  undefined2 uStack_9c;
  undefined2 uStack_9a;
  undefined2 uStack_98;
  undefined2 uStack_96;
  undefined2 uStack_94;
  undefined2 uStack_92;
  undefined2 uStack_90;
  undefined2 uStack_8e;
  undefined2 uStack_8c;
  undefined2 uStack_8a;
  undefined2 uStack_88;
  undefined2 uStack_86;
  undefined2 uStack_84;
  undefined2 uStack_82;
  undefined2 local_80;
  undefined2 uStack_7e;
  undefined2 uStack_7c;
  undefined2 uStack_7a;
  undefined2 uStack_78;
  undefined2 uStack_76;
  undefined2 uStack_74;
  undefined2 uStack_72;
  undefined2 uStack_70;
  undefined2 uStack_6e;
  undefined2 uStack_6c;
  undefined2 uStack_6a;
  undefined2 uStack_68;
  undefined2 uStack_66;
  undefined2 uStack_64;
  undefined2 uStack_62;
  
  if (_s2 == (char *)0x0) {
    parasail_sw_table_diag_avx2_256_16_cold_7();
  }
  else if (s2Len < 1) {
    parasail_sw_table_diag_avx2_256_16_cold_6();
  }
  else if (open < 0) {
    parasail_sw_table_diag_avx2_256_16_cold_5();
  }
  else if (gap < 0) {
    parasail_sw_table_diag_avx2_256_16_cold_4();
  }
  else if (matrix == (parasail_matrix_t *)0x0) {
    parasail_sw_table_diag_avx2_256_16_cold_3();
  }
  else {
    if (matrix->type == 0) {
      if (_s1 == (char *)0x0) {
        parasail_sw_table_diag_avx2_256_16_cold_2();
        return (parasail_result_t *)0x0;
      }
      uVar39 = (ulong)(uint)_s1Len;
      if (_s1Len < 1) {
        parasail_sw_table_diag_avx2_256_16_cold_1();
        return (parasail_result_t *)0x0;
      }
    }
    else {
      uVar39 = (ulong)(uint)matrix->length;
    }
    iVar30 = matrix->min;
    iVar36 = -iVar30;
    if (iVar30 != -open && SBORROW4(iVar30,-open) == iVar30 + open < 0) {
      iVar36 = open;
    }
    uVar38 = iVar36 - 0x7fff;
    sVar18 = 0x7ffe - (short)matrix->max;
    iVar66 = (int16_t)uVar38;
    local_160._2_2_ = iVar66;
    local_160._0_2_ = iVar66;
    local_160._4_2_ = iVar66;
    local_160._6_2_ = iVar66;
    local_160._8_2_ = iVar66;
    local_160._10_2_ = iVar66;
    local_160._12_2_ = iVar66;
    local_160._14_2_ = iVar66;
    local_160._16_2_ = iVar66;
    local_160._18_2_ = iVar66;
    local_160._20_2_ = iVar66;
    local_160._22_2_ = iVar66;
    local_160._24_2_ = iVar66;
    local_160._26_2_ = iVar66;
    local_160._28_2_ = iVar66;
    local_160._30_2_ = iVar66;
    local_200._2_2_ = iVar66;
    local_200._0_2_ = iVar66;
    local_200._4_2_ = iVar66;
    local_200._6_2_ = iVar66;
    local_200._8_2_ = iVar66;
    local_200._10_2_ = iVar66;
    local_200._12_2_ = iVar66;
    local_200._14_2_ = iVar66;
    local_200._16_2_ = iVar66;
    local_200._18_2_ = iVar66;
    local_200._20_2_ = iVar66;
    local_200._22_2_ = iVar66;
    local_200._24_2_ = iVar66;
    local_200._26_2_ = iVar66;
    local_200._28_2_ = iVar66;
    local_200._30_2_ = iVar66;
    local_1c0._2_2_ = iVar66;
    local_1c0._0_2_ = iVar66;
    local_1c0._4_2_ = iVar66;
    local_1c0._6_2_ = iVar66;
    local_1c0._8_2_ = iVar66;
    local_1c0._10_2_ = iVar66;
    local_1c0._12_2_ = iVar66;
    local_1c0._14_2_ = iVar66;
    local_1c0._16_2_ = iVar66;
    local_1c0._18_2_ = iVar66;
    local_1c0._20_2_ = iVar66;
    local_1c0._22_2_ = iVar66;
    local_1c0._24_2_ = iVar66;
    local_1c0._26_2_ = iVar66;
    local_1c0._28_2_ = iVar66;
    local_1c0._30_2_ = iVar66;
    uVar34 = (uint)uVar39;
    ppVar31 = parasail_result_new_table1(uVar34,s2Len);
    if (ppVar31 != (parasail_result_t *)0x0) {
      ppVar31->flag = ppVar31->flag | 0x10221004;
      uVar58 = (ulong)(s2Len + 0x1e);
      ptr = (undefined1 (*) [16])parasail_memalign_int16_t(0x20,uVar58);
      ptr_00 = parasail_memalign_int16_t(0x20,uVar58);
      ptr_01 = parasail_memalign_int16_t(0x20,uVar58);
      if (ptr_01 != (int16_t *)0x0 && (ptr_00 != (int16_t *)0x0 && ptr != (undefined1 (*) [16])0x0))
      {
        if (matrix->type == 0) {
          iVar30 = uVar34 + 0xf;
          ptr_02 = parasail_memalign_int16_t(0x20,(long)iVar30);
          if (ptr_02 == (int16_t *)0x0) {
            return (parasail_result_t *)0x0;
          }
          if (0 < (int)uVar34) {
            piVar3 = matrix->mapper;
            uVar58 = 0;
            do {
              ptr_02[uVar58] = (int16_t)piVar3[(byte)_s1[uVar58]];
              uVar58 = uVar58 + 1;
            } while (uVar39 != uVar58);
          }
          iVar36 = uVar34 + 1;
          if ((int)(uVar34 + 1) < iVar30) {
            iVar36 = iVar30;
          }
          memset(ptr_02 + (int)uVar34,0,(ulong)(~uVar34 + iVar36) * 2 + 2);
        }
        else {
          ptr_02 = (int16_t *)0x0;
        }
        uVar20 = s2Len + 0xf;
        auVar70._2_2_ = iVar66;
        auVar70._0_2_ = iVar66;
        auVar70._4_2_ = iVar66;
        auVar70._6_2_ = iVar66;
        auVar70._8_2_ = iVar66;
        auVar70._10_2_ = iVar66;
        auVar70._12_2_ = iVar66;
        auVar70._14_2_ = iVar66;
        auVar11._16_2_ = iVar66;
        auVar11._0_16_ = auVar70;
        auVar11._18_2_ = iVar66;
        auVar11._20_2_ = iVar66;
        auVar11._22_2_ = iVar66;
        auVar11._24_2_ = iVar66;
        auVar11._26_2_ = iVar66;
        auVar11._28_2_ = iVar66;
        auVar11._30_2_ = iVar66;
        auVar67 = vpslldq_avx2(ZEXT1632(auVar70),0xe);
        local_100 = vpblendw_avx2(auVar11,auVar67,0x80);
        local_80 = (undefined2)open;
        local_a0 = (undefined2)gap;
        local_120 = (undefined2)uVar39;
        local_c0 = (undefined2)s2Len;
        piVar3 = matrix->mapper;
        uVar58 = 1;
        if (1 < s2Len) {
          uVar58 = (ulong)(uint)s2Len;
        }
        uVar37 = 0;
        do {
          *(short *)(ptr[1] + uVar37 * 2 + 0xe) = (short)piVar3[(byte)_s2[uVar37]];
          uVar37 = uVar37 + 1;
        } while (uVar58 != uVar37);
        *(undefined1 (*) [16])(*ptr + 0xe) = (undefined1  [16])0x0;
        *ptr = (undefined1  [16])0x0;
        uVar37 = (ulong)(uint)s2Len;
        uVar19 = s2Len + 1U;
        if ((int)(s2Len + 1U) < (int)uVar20) {
          uVar19 = uVar20;
        }
        uVar64 = 0;
        local_1a0 = sVar18;
        sStack_19e = sVar18;
        sStack_19c = sVar18;
        sStack_19a = sVar18;
        sStack_198 = sVar18;
        sStack_196 = sVar18;
        sStack_194 = sVar18;
        sStack_192 = sVar18;
        sStack_190 = sVar18;
        sStack_18e = sVar18;
        sStack_18c = sVar18;
        sStack_18a = sVar18;
        sStack_188 = sVar18;
        sStack_186 = sVar18;
        sStack_184 = sVar18;
        sStack_182 = sVar18;
        uStack_11e = local_120;
        uStack_11c = local_120;
        uStack_11a = local_120;
        uStack_118 = local_120;
        uStack_116 = local_120;
        uStack_114 = local_120;
        uStack_112 = local_120;
        uStack_110 = local_120;
        uStack_10e = local_120;
        uStack_10c = local_120;
        uStack_10a = local_120;
        uStack_108 = local_120;
        uStack_106 = local_120;
        uStack_104 = local_120;
        uStack_102 = local_120;
        uStack_be = local_c0;
        uStack_bc = local_c0;
        uStack_ba = local_c0;
        uStack_b8 = local_c0;
        uStack_b6 = local_c0;
        uStack_b4 = local_c0;
        uStack_b2 = local_c0;
        uStack_b0 = local_c0;
        uStack_ae = local_c0;
        uStack_ac = local_c0;
        uStack_aa = local_c0;
        uStack_a8 = local_c0;
        uStack_a6 = local_c0;
        uStack_a4 = local_c0;
        uStack_a2 = local_c0;
        uStack_9e = local_a0;
        uStack_9c = local_a0;
        uStack_9a = local_a0;
        uStack_98 = local_a0;
        uStack_96 = local_a0;
        uStack_94 = local_a0;
        uStack_92 = local_a0;
        uStack_90 = local_a0;
        uStack_8e = local_a0;
        uStack_8c = local_a0;
        uStack_8a = local_a0;
        uStack_88 = local_a0;
        uStack_86 = local_a0;
        uStack_84 = local_a0;
        uStack_82 = local_a0;
        uStack_7e = local_80;
        uStack_7c = local_80;
        uStack_7a = local_80;
        uStack_78 = local_80;
        uStack_76 = local_80;
        uStack_74 = local_80;
        uStack_72 = local_80;
        uStack_70 = local_80;
        uStack_6e = local_80;
        uStack_6c = local_80;
        uStack_6a = local_80;
        uStack_68 = local_80;
        uStack_66 = local_80;
        uStack_64 = local_80;
        uStack_62 = local_80;
        memset(ptr[1] + uVar37 * 2 + 0xe,0,(ulong)(~s2Len + uVar19) * 2 + 2);
        do {
          ptr_00[uVar64 + 0xf] = 0;
          ptr_01[uVar64 + 0xf] = iVar66;
          uVar64 = uVar64 + 1;
        } while (uVar58 != uVar64);
        lVar32 = 0;
        do {
          ptr_00[lVar32] = iVar66;
          ptr_01[lVar32] = iVar66;
          lVar32 = lVar32 + 1;
        } while (lVar32 != 0xf);
        lVar32 = uVar37 + 0xf;
        do {
          ptr_00[lVar32] = iVar66;
          ptr_01[lVar32] = iVar66;
          lVar32 = lVar32 + 1;
          s2Len = s2Len + 1;
        } while (s2Len < (int)uVar20);
        auVar68 = ZEXT3264(local_200);
        if ((int)uVar34 < 1) {
          local_1e0._2_2_ = iVar66;
          local_1e0._0_2_ = iVar66;
          local_1e0._4_2_ = iVar66;
          local_1e0._6_2_ = iVar66;
          local_1e0._10_2_ = iVar66;
          local_1e0._8_2_ = iVar66;
          local_1e0._12_2_ = iVar66;
          local_1e0._14_2_ = iVar66;
          local_1e0._18_2_ = iVar66;
          local_1e0._16_2_ = iVar66;
          local_1e0._20_2_ = iVar66;
          local_1e0._22_2_ = iVar66;
          local_1e0._26_2_ = iVar66;
          local_1e0._24_2_ = iVar66;
          local_1e0._28_2_ = iVar66;
          local_1e0._30_2_ = iVar66;
          auVar67._2_2_ = sStack_19e;
          auVar67._0_2_ = local_1a0;
          auVar67._4_2_ = sStack_19c;
          auVar67._6_2_ = sStack_19a;
          auVar67._8_2_ = sStack_198;
          auVar67._10_2_ = sStack_196;
          auVar67._12_2_ = sStack_194;
          auVar67._14_2_ = sStack_192;
          auVar67._16_2_ = sStack_190;
          auVar67._18_2_ = sStack_18e;
          auVar67._20_2_ = sStack_18c;
          auVar67._22_2_ = sStack_18a;
          auVar67._24_2_ = sStack_188;
          auVar67._26_2_ = sStack_186;
          auVar67._28_2_ = sStack_184;
          auVar67._30_2_ = sStack_182;
        }
        else {
          uVar34 = uVar34 - 1;
          uVar58 = 1;
          if (1 < (int)uVar20) {
            uVar58 = (ulong)uVar20;
          }
          lVar32 = uVar37 * 0x40;
          local_2d8 = uVar37 * 0x3c + -0x3c;
          local_2e0 = uVar37 * 0x38 + -0x38;
          local_2e8 = uVar37 * 0x34 + -0x34;
          local_2f0 = uVar37 * 0x18 + -0x18;
          local_2f8 = uVar37 * 0xc + -0xc;
          local_300 = uVar37 * 0x30 + -0x30;
          local_308 = uVar37 * 0x2c + -0x2c;
          local_310 = uVar37 * 0x20 + -0x20;
          local_318 = uVar37 * 0x24 + -0x24;
          local_320 = uVar37 * 0x1c + -0x1c;
          local_328 = uVar37 * 0x28 + -0x28;
          local_330 = uVar37 * 0x14 + -0x14;
          local_338 = uVar37 * 0x10 + -0x10;
          local_2c0._8_8_ = 0x80009000a000b;
          local_2c0._0_8_ = 0xc000d000e000f;
          local_2c0._16_8_ = 0x4000500060007;
          local_2c0._24_8_ = 0x100020003;
          local_e0 = 1;
          uStack_de = 1;
          uStack_dc = 1;
          uStack_da = 1;
          uStack_d8 = 1;
          uStack_d6 = 1;
          uStack_d4 = 1;
          uStack_d2 = 1;
          uStack_d0 = 1;
          uStack_ce = 1;
          uStack_cc = 1;
          uStack_ca = 1;
          uStack_c8 = 1;
          uStack_c6 = 1;
          uStack_c4 = 1;
          uStack_c2 = 1;
          local_140 = 0x10;
          uStack_13e = 0x10;
          uStack_13c = 0x10;
          uStack_13a = 0x10;
          uStack_138 = 0x10;
          uStack_136 = 0x10;
          uStack_134 = 0x10;
          uStack_132 = 0x10;
          uStack_130 = 0x10;
          uStack_12e = 0x10;
          uStack_12c = 0x10;
          uStack_12a = 0x10;
          uStack_128 = 0x10;
          uStack_126 = 0x10;
          uStack_124 = 0x10;
          uStack_122 = 0x10;
          local_180._2_2_ = sStack_19e;
          local_180._0_2_ = local_1a0;
          local_180._4_2_ = sStack_19c;
          local_180._6_2_ = sStack_19a;
          local_180._10_2_ = sStack_196;
          local_180._8_2_ = sStack_198;
          local_180._12_2_ = sStack_194;
          local_180._14_2_ = sStack_192;
          local_180._18_2_ = sStack_18e;
          local_180._16_2_ = sStack_190;
          local_180._20_2_ = sStack_18c;
          local_180._22_2_ = sStack_18a;
          local_180._26_2_ = sStack_186;
          local_180._24_2_ = sStack_188;
          local_180._28_2_ = sStack_184;
          local_180._30_2_ = sStack_182;
          local_1e0._2_2_ = iVar66;
          local_1e0._0_2_ = iVar66;
          local_1e0._4_2_ = iVar66;
          local_1e0._6_2_ = iVar66;
          local_1e0._10_2_ = iVar66;
          local_1e0._8_2_ = iVar66;
          local_1e0._12_2_ = iVar66;
          local_1e0._14_2_ = iVar66;
          local_1e0._18_2_ = iVar66;
          local_1e0._16_2_ = iVar66;
          local_1e0._20_2_ = iVar66;
          local_1e0._22_2_ = iVar66;
          local_1e0._26_2_ = iVar66;
          local_1e0._24_2_ = iVar66;
          local_1e0._28_2_ = iVar66;
          local_1e0._30_2_ = iVar66;
          piVar3 = matrix->matrix;
          local_2c8 = uVar37 * 4 + -4;
          local_340 = uVar37 * 8 + -8;
          local_2d0 = 0;
          uVar64 = 0;
          do {
            iVar30 = matrix->type;
            uVar19 = (uint)uVar64;
            uVar20 = uVar19;
            if (iVar30 == 0) {
              uVar20 = (uint)ptr_02[uVar64];
            }
            uVar33 = uVar64 | 1;
            if (iVar30 == 0) {
              uVar41 = (int)ptr_02[uVar33];
            }
            else {
              uVar41 = uVar34;
              if (uVar33 < uVar39) {
                uVar41 = uVar19 | 1;
              }
            }
            uVar43 = uVar64 | 2;
            if (iVar30 == 0) {
              uVar46 = (int)ptr_02[uVar43];
            }
            else {
              uVar46 = uVar34;
              if (uVar43 < uVar39) {
                uVar46 = uVar19 | 2;
              }
            }
            uVar47 = uVar64 | 3;
            if (iVar30 == 0) {
              uVar49 = (int)ptr_02[uVar47];
            }
            else {
              uVar49 = uVar34;
              if (uVar47 < uVar39) {
                uVar49 = uVar19 | 3;
              }
            }
            uVar55 = uVar64 | 4;
            if (iVar30 == 0) {
              uVar50 = (int)ptr_02[uVar55];
            }
            else {
              uVar50 = uVar34;
              if (uVar55 < uVar39) {
                uVar50 = uVar19 | 4;
              }
            }
            uVar59 = uVar64 | 5;
            if (iVar30 == 0) {
              uVar51 = (int)ptr_02[uVar59];
            }
            else {
              uVar51 = uVar34;
              if (uVar59 < uVar39) {
                uVar51 = uVar19 | 5;
              }
            }
            uVar60 = uVar64 | 6;
            if (iVar30 == 0) {
              uVar52 = (int)ptr_02[uVar60];
            }
            else {
              uVar52 = uVar34;
              if (uVar60 < uVar39) {
                uVar52 = uVar19 | 6;
              }
            }
            iVar36 = matrix->size;
            uVar65 = uVar64 | 7;
            if (iVar30 == 0) {
              uVar21 = (int)ptr_02[uVar65];
            }
            else {
              uVar21 = uVar34;
              if (uVar65 < uVar39) {
                uVar21 = uVar19 | 7;
              }
            }
            uVar53 = uVar64 | 8;
            if (iVar30 == 0) {
              uVar22 = (int)ptr_02[uVar53];
            }
            else {
              uVar22 = uVar34;
              if (uVar53 < uVar39) {
                uVar22 = uVar19 | 8;
              }
            }
            uVar44 = uVar64 | 9;
            if (iVar30 == 0) {
              uVar23 = (int)ptr_02[uVar44];
            }
            else {
              uVar23 = uVar34;
              if (uVar44 < uVar39) {
                uVar23 = uVar19 | 9;
              }
            }
            uVar54 = uVar64 | 10;
            if (iVar30 == 0) {
              uVar24 = (int)ptr_02[uVar54];
            }
            else {
              uVar24 = uVar34;
              if (uVar54 < uVar39) {
                uVar24 = uVar19 | 10;
              }
            }
            uVar56 = uVar64 | 0xb;
            if (iVar30 == 0) {
              uVar25 = (int)ptr_02[uVar56];
            }
            else {
              uVar25 = uVar34;
              if (uVar56 < uVar39) {
                uVar25 = uVar19 | 0xb;
              }
            }
            uVar57 = uVar64 | 0xc;
            if (iVar30 == 0) {
              uVar26 = (int)ptr_02[uVar57];
            }
            else {
              uVar26 = uVar34;
              if (uVar57 < uVar39) {
                uVar26 = uVar19 | 0xc;
              }
            }
            uVar61 = uVar64 | 0xd;
            if (iVar30 == 0) {
              uVar27 = (int)ptr_02[uVar61];
            }
            else {
              uVar27 = uVar34;
              if (uVar61 < uVar39) {
                uVar27 = uVar19 | 0xd;
              }
            }
            uVar62 = uVar64 | 0xe;
            if (iVar30 == 0) {
              local_3a0 = (int)ptr_02[uVar62];
            }
            else {
              local_3a0 = uVar34;
              if (uVar62 < uVar39) {
                local_3a0 = uVar19 | 0xe;
              }
            }
            uVar45 = uVar64 | 0xf;
            if (iVar30 == 0) {
              uVar48 = (int)ptr_02[uVar45];
            }
            else {
              uVar48 = uVar34;
              if (uVar45 < uVar39) {
                uVar48 = uVar19 | 0xf;
              }
            }
            auVar12._2_2_ = uStack_11e;
            auVar12._0_2_ = local_120;
            auVar12._4_2_ = uStack_11c;
            auVar12._6_2_ = uStack_11a;
            auVar12._8_2_ = uStack_118;
            auVar12._10_2_ = uStack_116;
            auVar12._12_2_ = uStack_114;
            auVar12._14_2_ = uStack_112;
            auVar12._16_2_ = uStack_110;
            auVar12._18_2_ = uStack_10e;
            auVar12._20_2_ = uStack_10c;
            auVar12._22_2_ = uStack_10a;
            auVar12._24_2_ = uStack_108;
            auVar12._26_2_ = uStack_106;
            auVar12._28_2_ = uStack_104;
            auVar12._30_2_ = uStack_102;
            auVar9 = vpcmpgtw_avx2(auVar12,local_2c0);
            auVar11 = vpmovsxbw_avx2(_DAT_008d4a94);
            auVar7._2_2_ = iVar66;
            auVar7._0_2_ = iVar66;
            auVar7._4_2_ = iVar66;
            auVar7._6_2_ = iVar66;
            auVar7._8_2_ = iVar66;
            auVar7._10_2_ = iVar66;
            auVar7._12_2_ = iVar66;
            auVar7._14_2_ = iVar66;
            auVar7._16_2_ = iVar66;
            auVar7._18_2_ = iVar66;
            auVar7._20_2_ = iVar66;
            auVar7._22_2_ = iVar66;
            auVar7._24_2_ = iVar66;
            auVar7._26_2_ = iVar66;
            auVar7._28_2_ = iVar66;
            auVar7._30_2_ = iVar66;
            uVar63 = 0;
            auVar12 = auVar7;
            auVar67 = local_100;
            auVar13 = local_100;
            do {
              auVar70 = vpinsrw_avx(ZEXT416((uint)piVar3[(long)(int)(uVar21 * iVar36) +
                                                         (long)*(short *)(ptr[1] + uVar63 * 2)]),
                                    (uint)*(ushort *)
                                           (piVar3 + (long)(int)(uVar52 * iVar36) +
                                                     (long)*(short *)(ptr[1] + uVar63 * 2 + 2)),1);
              auVar70 = vpinsrw_avx(auVar70,(uint)*(ushort *)
                                                   (piVar3 + (long)(int)(uVar51 * iVar36) +
                                                             (long)*(short *)(ptr[1] + uVar63 * 2 +
                                                                                       4)),2);
              auVar70 = vpinsrw_avx(auVar70,(uint)*(ushort *)
                                                   (piVar3 + (long)(int)(uVar50 * iVar36) +
                                                             (long)*(short *)(ptr[1] + uVar63 * 2 +
                                                                                       6)),3);
              auVar70 = vpinsrw_avx(auVar70,(uint)*(ushort *)
                                                   (piVar3 + (long)(int)(uVar49 * iVar36) +
                                                             (long)*(short *)(ptr[1] + uVar63 * 2 +
                                                                                       8)),4);
              auVar70 = vpinsrw_avx(auVar70,(uint)*(ushort *)
                                                   (piVar3 + (long)(int)(uVar46 * iVar36) +
                                                             (long)*(short *)(ptr[1] + uVar63 * 2 +
                                                                                       10)),5);
              auVar70 = vpinsrw_avx(auVar70,(uint)*(ushort *)
                                                   (piVar3 + (long)(int)(uVar41 * iVar36) +
                                                             (long)*(short *)(ptr[1] + uVar63 * 2 +
                                                                                       0xc)),6);
              auVar70 = vpinsrw_avx(auVar70,(uint)*(ushort *)
                                                   (piVar3 + (long)(int)(uVar20 * iVar36) +
                                                             (long)*(short *)(ptr[1] + uVar63 * 2 +
                                                                                       0xe)),7);
              auVar71 = vpinsrw_avx(ZEXT416((uint)piVar3[(long)(int)(uVar48 * iVar36) +
                                                         (long)*(short *)(*ptr + uVar63 * 2)]),
                                    (uint)*(ushort *)
                                           (piVar3 + (long)(int)(local_3a0 * iVar36) +
                                                     (long)*(short *)(*ptr + uVar63 * 2 + 2)),1);
              auVar71 = vpinsrw_avx(auVar71,(uint)*(ushort *)
                                                   (piVar3 + (long)(int)(uVar27 * iVar36) +
                                                             (long)*(short *)(*ptr + uVar63 * 2 + 4)
                                                   ),2);
              auVar71 = vpinsrw_avx(auVar71,(uint)*(ushort *)
                                                   (piVar3 + (long)(int)(uVar26 * iVar36) +
                                                             (long)*(short *)(*ptr + uVar63 * 2 + 6)
                                                   ),3);
              auVar71 = vpinsrw_avx(auVar71,(uint)*(ushort *)
                                                   (piVar3 + (long)(int)(uVar25 * iVar36) +
                                                             (long)*(short *)(*ptr + uVar63 * 2 + 8)
                                                   ),4);
              auVar71 = vpinsrw_avx(auVar71,(uint)*(ushort *)
                                                   (piVar3 + (long)(int)(uVar24 * iVar36) +
                                                             (long)*(short *)(*ptr + uVar63 * 2 + 10
                                                                             )),5);
              auVar71 = vpinsrw_avx(auVar71,(uint)*(ushort *)
                                                   (piVar3 + (long)(int)(uVar23 * iVar36) +
                                                             (long)*(short *)(*ptr + uVar63 * 2 +
                                                                                     0xc)),6);
              auVar71 = vpinsrw_avx(auVar71,(uint)*(ushort *)
                                                   (piVar3 + (long)(int)(uVar22 * iVar36) +
                                                             (long)*(short *)(*ptr + uVar63 * 2 +
                                                                                     0xe)),7);
              iVar1 = ptr_00[uVar63 + 0xf];
              auVar74._2_2_ = iVar1;
              auVar74._0_2_ = iVar1;
              auVar74._4_2_ = iVar1;
              auVar74._6_2_ = iVar1;
              auVar74._8_2_ = iVar1;
              auVar74._10_2_ = iVar1;
              auVar74._12_2_ = iVar1;
              auVar74._14_2_ = iVar1;
              auVar74._16_2_ = iVar1;
              auVar74._18_2_ = iVar1;
              auVar74._20_2_ = iVar1;
              auVar74._22_2_ = iVar1;
              auVar74._24_2_ = iVar1;
              auVar74._26_2_ = iVar1;
              auVar74._28_2_ = iVar1;
              auVar74._30_2_ = iVar1;
              auVar72._0_16_ = ZEXT116(0) * auVar70 + ZEXT116(1) * auVar71;
              auVar72._16_16_ = ZEXT116(1) * auVar70;
              auVar73 = vpalignr_avx2(ZEXT1632(auVar67._16_16_),auVar67,2);
              auVar8 = vpblendw_avx2(auVar73,auVar74,0x80);
              auVar72 = vpaddsw_avx2(auVar13,auVar72);
              auVar13 = vpblendd_avx2(auVar73,auVar8,0xf0);
              iVar1 = ptr_01[uVar63 + 0xf];
              auVar73._2_2_ = iVar1;
              auVar73._0_2_ = iVar1;
              auVar73._4_2_ = iVar1;
              auVar73._6_2_ = iVar1;
              auVar73._8_2_ = iVar1;
              auVar73._10_2_ = iVar1;
              auVar73._12_2_ = iVar1;
              auVar73._14_2_ = iVar1;
              auVar73._16_2_ = iVar1;
              auVar73._18_2_ = iVar1;
              auVar73._20_2_ = iVar1;
              auVar73._22_2_ = iVar1;
              auVar73._24_2_ = iVar1;
              auVar73._26_2_ = iVar1;
              auVar73._28_2_ = iVar1;
              auVar73._30_2_ = iVar1;
              auVar7 = vpalignr_avx2(ZEXT1632(auVar7._16_16_),auVar7,2);
              auVar73 = vpblendw_avx2(auVar7,auVar73,0x80);
              auVar73 = vpblendd_avx2(auVar7,auVar73,0xf0);
              auVar69._2_2_ = uStack_7e;
              auVar69._0_2_ = local_80;
              auVar69._4_2_ = uStack_7c;
              auVar69._6_2_ = uStack_7a;
              auVar69._8_2_ = uStack_78;
              auVar69._10_2_ = uStack_76;
              auVar69._12_2_ = uStack_74;
              auVar69._14_2_ = uStack_72;
              auVar69._16_2_ = uStack_70;
              auVar69._18_2_ = uStack_6e;
              auVar69._20_2_ = uStack_6c;
              auVar69._22_2_ = uStack_6a;
              auVar69._24_2_ = uStack_68;
              auVar69._26_2_ = uStack_66;
              auVar69._28_2_ = uStack_64;
              auVar69._30_2_ = uStack_62;
              auVar7 = vpsubsw_avx2(auVar13,auVar69);
              auVar8._2_2_ = uStack_9e;
              auVar8._0_2_ = local_a0;
              auVar8._4_2_ = uStack_9c;
              auVar8._6_2_ = uStack_9a;
              auVar8._8_2_ = uStack_98;
              auVar8._10_2_ = uStack_96;
              auVar8._12_2_ = uStack_94;
              auVar8._14_2_ = uStack_92;
              auVar8._16_2_ = uStack_90;
              auVar8._18_2_ = uStack_8e;
              auVar8._20_2_ = uStack_8c;
              auVar8._22_2_ = uStack_8a;
              auVar8._24_2_ = uStack_88;
              auVar8._26_2_ = uStack_86;
              auVar8._28_2_ = uStack_84;
              auVar8._30_2_ = uStack_82;
              auVar73 = vpsubsw_avx2(auVar73,auVar8);
              auVar7 = vpmaxsw_avx2(auVar7,auVar73);
              auVar67 = vpsubsw_avx2(auVar67,auVar69);
              auVar12 = vpsubsw_avx2(auVar12,auVar8);
              auVar73 = vpmaxsw_avx2(auVar67,auVar12);
              auVar67 = vpmaxsw_avx2(auVar73,auVar7);
              auVar67 = vpmaxsw_avx2(auVar67,_DAT_008d4700);
              auVar72 = vpmaxsw_avx2(auVar67,auVar72);
              auVar12 = vpcmpeqw_avx2(auVar11,_DAT_008d4ac0);
              auVar67 = vpandn_avx2(auVar12,auVar72);
              if (0xf < uVar63) {
                local_180 = vpminsw_avx2(auVar67,local_180);
                local_1e0 = vpmaxsw_avx2(auVar67,local_1e0);
              }
              piVar4 = ((ppVar31->field_4).rowcols)->score_row;
              auVar70 = auVar67._0_16_;
              auVar71 = auVar67._16_16_;
              if (uVar63 < uVar37) {
                uVar28 = vpextrw_avx(auVar71,7);
                *(undefined4 *)((long)piVar4 + uVar63 * 4 + local_2d0) = uVar28;
              }
              if (uVar63 - 1 < uVar37 && uVar33 < uVar39) {
                uVar28 = vpextrw_avx(auVar71,6);
                *(undefined4 *)((long)piVar4 + uVar63 * 4 + local_2c8) = uVar28;
              }
              if ((uVar43 < uVar39) && ((long)(uVar63 - 2) < (long)uVar37 && 1 < uVar63)) {
                uVar28 = vpextrw_avx(auVar71,5);
                *(undefined4 *)((long)piVar4 + uVar63 * 4 + local_340) = uVar28;
              }
              if ((uVar47 < uVar39) && ((long)(uVar63 - 3) < (long)uVar37 && 2 < uVar63)) {
                uVar28 = vpextrw_avx(auVar71,4);
                *(undefined4 *)((long)piVar4 + uVar63 * 4 + local_2f8) = uVar28;
              }
              if ((uVar55 < uVar39) && ((long)(uVar63 - 4) < (long)uVar37 && 3 < uVar63)) {
                uVar28 = vpextrw_avx(auVar71,3);
                *(undefined4 *)((long)piVar4 + uVar63 * 4 + local_338) = uVar28;
              }
              if ((uVar59 < uVar39) && ((long)(uVar63 - 5) < (long)uVar37 && 4 < uVar63)) {
                uVar28 = vpextrw_avx(auVar71,2);
                *(undefined4 *)((long)piVar4 + uVar63 * 4 + local_330) = uVar28;
              }
              if ((uVar60 < uVar39) && ((long)(uVar63 - 6) < (long)uVar37 && 5 < uVar63)) {
                uVar28 = vpextrw_avx(auVar71,1);
                *(undefined4 *)((long)piVar4 + uVar63 * 4 + local_2f0) = uVar28;
              }
              if ((uVar65 < uVar39) && ((long)(uVar63 - 7) < (long)uVar37 && 6 < uVar63)) {
                uVar28 = vpextrw_avx(auVar71,0);
                *(undefined4 *)((long)piVar4 + uVar63 * 4 + local_320) = uVar28;
              }
              if ((uVar53 < uVar39) && ((long)(uVar63 - 8) < (long)uVar37 && 7 < uVar63)) {
                uVar28 = vpextrw_avx(auVar70,7);
                *(undefined4 *)((long)piVar4 + uVar63 * 4 + local_310) = uVar28;
              }
              if ((uVar44 < uVar39) && ((long)(uVar63 - 9) < (long)uVar37 && 8 < uVar63)) {
                uVar28 = vpextrw_avx(auVar70,6);
                *(undefined4 *)((long)piVar4 + uVar63 * 4 + local_318) = uVar28;
              }
              if ((uVar54 < uVar39) && ((long)(uVar63 - 10) < (long)uVar37 && 9 < uVar63)) {
                uVar28 = vpextrw_avx(auVar70,5);
                *(undefined4 *)((long)piVar4 + uVar63 * 4 + local_328) = uVar28;
              }
              if ((uVar56 < uVar39) && ((long)(uVar63 - 0xb) < (long)uVar37 && 10 < uVar63)) {
                uVar28 = vpextrw_avx(auVar70,4);
                *(undefined4 *)((long)piVar4 + uVar63 * 4 + local_308) = uVar28;
              }
              if ((uVar57 < uVar39) && ((long)(uVar63 - 0xc) < (long)uVar37 && 0xb < uVar63)) {
                uVar28 = vpextrw_avx(auVar70,3);
                *(undefined4 *)((long)piVar4 + uVar63 * 4 + local_300) = uVar28;
              }
              if ((uVar61 < uVar39) && ((long)(uVar63 - 0xd) < (long)uVar37 && 0xc < uVar63)) {
                uVar28 = vpextrw_avx(auVar70,2);
                *(undefined4 *)((long)piVar4 + uVar63 * 4 + local_2e8) = uVar28;
              }
              if ((uVar62 < uVar39) && ((long)(uVar63 - 0xe) < (long)uVar37 && 0xd < uVar63)) {
                uVar28 = vpextrw_avx(auVar70,1);
                *(undefined4 *)((long)piVar4 + uVar63 * 4 + local_2e0) = uVar28;
              }
              auVar10._2_2_ = iVar66;
              auVar10._0_2_ = iVar66;
              auVar10._4_2_ = iVar66;
              auVar10._6_2_ = iVar66;
              auVar10._8_2_ = iVar66;
              auVar10._10_2_ = iVar66;
              auVar10._12_2_ = iVar66;
              auVar10._14_2_ = iVar66;
              auVar10._16_2_ = iVar66;
              auVar10._18_2_ = iVar66;
              auVar10._20_2_ = iVar66;
              auVar10._22_2_ = iVar66;
              auVar10._24_2_ = iVar66;
              auVar10._26_2_ = iVar66;
              auVar10._28_2_ = iVar66;
              auVar10._30_2_ = iVar66;
              auVar7 = vpblendvb_avx2(auVar7,auVar10,auVar12);
              if ((uVar45 < uVar39) && ((long)(uVar63 - 0xf) < (long)uVar37 && 0xe < uVar63)) {
                uVar28 = vpextrw_avx(auVar70,0);
                *(undefined4 *)((long)piVar4 + uVar63 * 4 + local_2d8) = uVar28;
              }
              vpextrw_avx(auVar70,0);
              vpextrw_avx(auVar7._0_16_,0);
              auVar17._2_2_ = uStack_be;
              auVar17._0_2_ = local_c0;
              auVar17._4_2_ = uStack_bc;
              auVar17._6_2_ = uStack_ba;
              auVar17._8_2_ = uStack_b8;
              auVar17._10_2_ = uStack_b6;
              auVar17._12_2_ = uStack_b4;
              auVar17._14_2_ = uStack_b2;
              auVar17._16_2_ = uStack_b0;
              auVar17._18_2_ = uStack_ae;
              auVar17._20_2_ = uStack_ac;
              auVar17._22_2_ = uStack_aa;
              auVar17._24_2_ = uStack_a8;
              auVar17._26_2_ = uStack_a6;
              auVar17._28_2_ = uStack_a4;
              auVar17._30_2_ = uStack_a2;
              auVar8 = vpcmpgtw_avx2(auVar17,auVar11);
              auVar8 = vpand_avx2(auVar9,auVar8);
              auVar69 = vpsraw_avx2(auVar11,0xf);
              auVar69 = vpandn_avx2(auVar69,auVar8);
              auVar70 = vpacksswb_avx(auVar69._0_16_,auVar69._16_16_);
              auVar74 = vpcmpeqw_avx2(auVar67,local_160);
              auVar10 = vpcmpgtw_avx2(auVar67,local_160);
              auVar8 = vpand_avx2(auVar10,auVar69);
              auVar71 = vpacksswb_avx(auVar8._0_16_,auVar8._16_16_);
              local_160 = vpblendvb_avx2(local_160,auVar72,auVar8);
              auVar72 = vpcmpgtw_avx2(local_1c0,auVar11);
              auVar72 = vpand_avx2(auVar72,auVar74);
              auVar6 = vpacksswb_avx(auVar72._0_16_,auVar72._16_16_);
              auVar70 = vpblendvb_avx(auVar71,auVar70,auVar6);
              auVar14._2_2_ = iVar66;
              auVar14._0_2_ = iVar66;
              auVar14._4_2_ = iVar66;
              auVar14._6_2_ = iVar66;
              auVar14._8_2_ = iVar66;
              auVar14._10_2_ = iVar66;
              auVar14._12_2_ = iVar66;
              auVar14._14_2_ = iVar66;
              auVar14._16_2_ = iVar66;
              auVar14._18_2_ = iVar66;
              auVar14._20_2_ = iVar66;
              auVar14._22_2_ = iVar66;
              auVar14._24_2_ = iVar66;
              auVar14._26_2_ = iVar66;
              auVar14._28_2_ = iVar66;
              auVar14._30_2_ = iVar66;
              auVar12 = vpblendvb_avx2(auVar73,auVar14,auVar12);
              auVar73 = vpmovsxbw_avx2(auVar70);
              local_200 = vpblendvb_avx2(auVar68._0_32_,local_2c0,auVar73);
              auVar68 = ZEXT3264(local_200);
              auVar72 = vpor_avx2(auVar72,auVar10);
              auVar72 = vpand_avx2(auVar69,auVar72);
              local_1c0 = vpblendvb_avx2(local_1c0,auVar11,auVar72);
              auVar16._8_2_ = 1;
              auVar16._0_8_ = 0x1000100010001;
              auVar16._10_2_ = 1;
              auVar16._12_2_ = 1;
              auVar16._14_2_ = 1;
              auVar16._16_2_ = 1;
              auVar16._18_2_ = 1;
              auVar16._20_2_ = 1;
              auVar16._22_2_ = 1;
              auVar16._24_2_ = 1;
              auVar16._26_2_ = 1;
              auVar16._28_2_ = 1;
              auVar16._30_2_ = 1;
              auVar11 = vpaddsw_avx2(auVar11,auVar16);
              uVar63 = uVar63 + 1;
            } while (uVar58 != uVar63);
            auVar9._8_2_ = 0x10;
            auVar9._0_8_ = 0x10001000100010;
            auVar9._10_2_ = 0x10;
            auVar9._12_2_ = 0x10;
            auVar9._14_2_ = 0x10;
            auVar9._16_2_ = 0x10;
            auVar9._18_2_ = 0x10;
            auVar9._20_2_ = 0x10;
            auVar9._22_2_ = 0x10;
            auVar9._24_2_ = 0x10;
            auVar9._26_2_ = 0x10;
            auVar9._28_2_ = 0x10;
            auVar9._30_2_ = 0x10;
            local_2c0 = vpaddsw_avx2(local_2c0,auVar9);
            uVar64 = uVar64 + 0x10;
            local_2d0 = local_2d0 + lVar32;
            local_2c8 = local_2c8 + lVar32;
            local_2d8 = local_2d8 + lVar32;
            local_2e0 = local_2e0 + lVar32;
            local_2e8 = local_2e8 + lVar32;
            local_300 = local_300 + lVar32;
            local_308 = local_308 + lVar32;
            local_328 = local_328 + lVar32;
            local_318 = local_318 + lVar32;
            local_310 = local_310 + lVar32;
            local_320 = local_320 + lVar32;
            local_2f0 = local_2f0 + lVar32;
            local_330 = local_330 + lVar32;
            local_338 = local_338 + lVar32;
            local_2f8 = local_2f8 + lVar32;
            local_340 = local_340 + lVar32;
            auVar67 = local_180;
          } while (uVar64 < uVar39);
        }
        lVar32 = 0;
        iVar29 = 0;
        iVar30 = 0;
        iVar35 = 0;
        iVar36 = 0;
        do {
          uVar2 = *(ushort *)(local_160 + lVar32 * 2);
          if ((short)(ushort)uVar38 < (short)uVar2) {
            uVar38 = (uint)uVar2;
            iVar30 = (int)*(short *)(local_200 + lVar32 * 2);
            iVar36 = (int)*(short *)(local_1c0 + lVar32 * 2);
            iVar35 = (int)*(short *)(local_1c0 + lVar32 * 2);
            iVar29 = (int)*(short *)(local_200 + lVar32 * 2);
          }
          else if (uVar2 == (ushort)uVar38) {
            iVar40 = (int)*(short *)(local_1c0 + lVar32 * 2);
            if (iVar40 < iVar36) {
              iVar30 = (int)*(short *)(local_200 + lVar32 * 2);
              iVar36 = iVar40;
              iVar35 = iVar40;
              iVar29 = (int)*(short *)(local_200 + lVar32 * 2);
            }
            else if (iVar36 == iVar40) {
              iVar42 = (int)*(short *)(local_200 + lVar32 * 2);
              iVar36 = iVar35;
              if (iVar42 < iVar30) {
                iVar36 = iVar40;
              }
              bVar5 = iVar42 <= iVar30;
              iVar30 = iVar29;
              iVar35 = iVar36;
              if (bVar5) {
                iVar30 = iVar42;
                iVar29 = iVar42;
              }
            }
          }
          sVar18 = (short)uVar38;
          lVar32 = lVar32 + 1;
        } while ((int)lVar32 != 0x10);
        auVar13._2_2_ = iVar66;
        auVar13._0_2_ = iVar66;
        auVar13._4_2_ = iVar66;
        auVar13._6_2_ = iVar66;
        auVar13._8_2_ = iVar66;
        auVar13._10_2_ = iVar66;
        auVar13._12_2_ = iVar66;
        auVar13._14_2_ = iVar66;
        auVar13._16_2_ = iVar66;
        auVar13._18_2_ = iVar66;
        auVar13._20_2_ = iVar66;
        auVar13._22_2_ = iVar66;
        auVar13._24_2_ = iVar66;
        auVar13._26_2_ = iVar66;
        auVar13._28_2_ = iVar66;
        auVar13._30_2_ = iVar66;
        auVar11 = vpcmpgtw_avx2(auVar13,auVar67);
        auVar15._2_2_ = sStack_19e;
        auVar15._0_2_ = local_1a0;
        auVar15._4_2_ = sStack_19c;
        auVar15._6_2_ = sStack_19a;
        auVar15._8_2_ = sStack_198;
        auVar15._10_2_ = sStack_196;
        auVar15._12_2_ = sStack_194;
        auVar15._14_2_ = sStack_192;
        auVar15._16_2_ = sStack_190;
        auVar15._18_2_ = sStack_18e;
        auVar15._20_2_ = sStack_18c;
        auVar15._22_2_ = sStack_18a;
        auVar15._24_2_ = sStack_188;
        auVar15._26_2_ = sStack_186;
        auVar15._28_2_ = sStack_184;
        auVar15._30_2_ = sStack_182;
        auVar67 = vpcmpgtw_avx2(local_1e0,auVar15);
        auVar11 = vpor_avx2(auVar11,auVar67);
        if ((((((((((((((((((((((((((((((((auVar11 >> 7 & (undefined1  [32])0x1) !=
                                          (undefined1  [32])0x0 ||
                                         (auVar11 >> 0xf & (undefined1  [32])0x1) !=
                                         (undefined1  [32])0x0) ||
                                        (auVar11 >> 0x17 & (undefined1  [32])0x1) !=
                                        (undefined1  [32])0x0) ||
                                       (auVar11 >> 0x1f & (undefined1  [32])0x1) !=
                                       (undefined1  [32])0x0) ||
                                      (auVar11 >> 0x27 & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0) ||
                                     (auVar11 >> 0x2f & (undefined1  [32])0x1) !=
                                     (undefined1  [32])0x0) ||
                                    (auVar11 >> 0x37 & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) ||
                                   (auVar11 >> 0x3f & (undefined1  [32])0x1) !=
                                   (undefined1  [32])0x0) ||
                                  (auVar11 >> 0x47 & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                  ) || (auVar11 >> 0x4f & (undefined1  [32])0x1) !=
                                       (undefined1  [32])0x0) ||
                                (auVar11 >> 0x57 & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                               || (auVar11 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               ) || (auVar11 >> 0x67 & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) ||
                             (auVar11 >> 0x6f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar11 >> 0x77 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(auVar11 >> 0x7f,0) != '\0') ||
                          (auVar11 >> 0x87 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar11 >> 0x8f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar11 >> 0x97 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       (auVar11 >> 0x9f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar11 >> 0xa7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     (auVar11 >> 0xaf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar11 >> 0xb7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar11 >> 0xbf,0) != '\0') ||
                  (auVar11 >> 199 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 (auVar11 >> 0xcf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar11 >> 0xd7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               (auVar11 >> 0xdf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar11 >> 0xe7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             (auVar11 >> 0xef & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar11 >> 0xf7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            auVar11[0x1f] < '\0') {
          *(byte *)&ppVar31->flag = (byte)ppVar31->flag | 0x40;
          sVar18 = 0;
          iVar36 = 0;
          iVar30 = 0;
        }
        ppVar31->score = (int)sVar18;
        ppVar31->end_query = iVar30;
        ppVar31->end_ref = iVar36;
        parasail_free(ptr_01);
        parasail_free(ptr_00);
        parasail_free(ptr);
        if (matrix->type == 0) {
          parasail_free(ptr_02);
          return ppVar31;
        }
        return ppVar31;
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* FNAME(
        const char * const restrict _s1, const int _s1Len,
        const char * const restrict _s2, const int s2Len,
        const int open, const int gap, const parasail_matrix_t *matrix)
{
    /* declare local variables */
    int32_t N = 0;
    int32_t PAD = 0;
    int32_t PAD2 = 0;
    int32_t s1Len = 0;
    int32_t s1Len_PAD = 0;
    int32_t s2Len_PAD = 0;
    int16_t * restrict s1 = NULL;
    int16_t * restrict s2B = NULL;
    int16_t * restrict _H_pr = NULL;
    int16_t * restrict _F_pr = NULL;
    int16_t * restrict s2 = NULL;
    int16_t * restrict H_pr = NULL;
    int16_t * restrict F_pr = NULL;
    parasail_result_t *result = NULL;
    int32_t i = 0;
    int32_t j = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int16_t NEG_LIMIT = 0;
    int16_t POS_LIMIT = 0;
    int16_t score = 0;
    __m256i vNegLimit;
    __m256i vPosLimit;
    __m256i vSaturationCheckMin;
    __m256i vSaturationCheckMax;
    __m256i vNegInf;
    __m256i vNegInf0;
    __m256i vOpen;
    __m256i vGap;
    __m256i vZero;
    __m256i vOne;
    __m256i vN;
    __m256i vNegOne;
    __m256i vI;
    __m256i vJreset;
    __m256i vMaxH;
    __m256i vEndI;
    __m256i vEndJ;
    __m256i vILimit;
    __m256i vJLimit;

    /* validate inputs */
    PARASAIL_CHECK_NULL(_s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);
    PARASAIL_CHECK_NULL(matrix);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        PARASAIL_CHECK_NULL(_s1);
        PARASAIL_CHECK_GT0(_s1Len);
    }

    /* initialize stack variables */
    N = 16; /* number of values in vector */
    PAD = N-1;
    PAD2 = PAD*2;
    s1Len = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ? _s1Len : matrix->length;
    s1Len_PAD = s1Len+PAD;
    s2Len_PAD = s2Len+PAD;
    i = 0;
    j = 0;
    end_query = 0;
    end_ref = 0;
    NEG_LIMIT = (-open < matrix->min ? INT16_MIN + open : INT16_MIN - matrix->min) + 1;
    POS_LIMIT = INT16_MAX - matrix->max - 1;
    score = NEG_LIMIT;
    vNegLimit = _mm256_set1_epi16(NEG_LIMIT);
    vPosLimit = _mm256_set1_epi16(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vNegInf = _mm256_set1_epi16(NEG_LIMIT);
    vNegInf0 = _mm256_srli_si256_rpl(vNegInf, 2); /* shift in a 0 */
    vOpen = _mm256_set1_epi16(open);
    vGap  = _mm256_set1_epi16(gap);
    vZero = _mm256_set1_epi16(0);
    vOne = _mm256_set1_epi16(1);
    vN = _mm256_set1_epi16(N);
    vNegOne = _mm256_set1_epi16(-1);
    vI = _mm256_set_epi16(0,1,2,3,4,5,6,7,8,9,10,11,12,13,14,15);
    vJreset = _mm256_set_epi16(0,-1,-2,-3,-4,-5,-6,-7,-8,-9,-10,-11,-12,-13,-14,-15);
    vMaxH = vNegInf;
    vEndI = vNegInf;
    vEndJ = vNegInf;
    vILimit = _mm256_set1_epi16(s1Len);
    vJLimit = _mm256_set1_epi16(s2Len);

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(s1Len, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(s1Len, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SW | PARASAIL_FLAG_DIAG
        | PARASAIL_FLAG_BITS_16 | PARASAIL_FLAG_LANES_16;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    s2B= parasail_memalign_int16_t(32, s2Len+PAD2);
    _H_pr = parasail_memalign_int16_t(32, s2Len+PAD2);
    _F_pr = parasail_memalign_int16_t(32, s2Len+PAD2);
    s2 = s2B+PAD; /* will allow later for negative indices */
    H_pr = _H_pr+PAD;
    F_pr = _F_pr+PAD;

    /* validate heap variables */
    if (!s2B) return NULL;
    if (!_H_pr) return NULL;
    if (!_F_pr) return NULL;

    /* convert _s1 from char to int in range 0-23 */
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        s1 = parasail_memalign_int16_t(32, s1Len+PAD);
        if (!s1) return NULL;
        for (i=0; i<s1Len; ++i) {
            s1[i] = matrix->mapper[(unsigned char)_s1[i]];
        }
        /* pad back of s1 with dummy values */
        for (i=s1Len; i<s1Len_PAD; ++i) {
            s1[i] = 0; /* point to first matrix row because we don't care */
        }
    }

    /* convert _s2 from char to int in range 0-23 */
    for (j=0; j<s2Len; ++j) {
        s2[j] = matrix->mapper[(unsigned char)_s2[j]];
    }
    /* pad front of s2 with dummy values */
    for (j=-PAD; j<0; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }
    /* pad back of s2 with dummy values */
    for (j=s2Len; j<s2Len_PAD; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }

    /* set initial values for stored row */
    for (j=0; j<s2Len; ++j) {
        H_pr[j] = 0;
        F_pr[j] = NEG_LIMIT;
    }
    /* pad front of stored row values */
    for (j=-PAD; j<0; ++j) {
        H_pr[j] = NEG_LIMIT;
        F_pr[j] = NEG_LIMIT;
    }
    /* pad back of stored row values */
    for (j=s2Len; j<s2Len+PAD; ++j) {
        H_pr[j] = NEG_LIMIT;
        F_pr[j] = NEG_LIMIT;
    }

    /* iterate over query sequence */
    for (i=0; i<s1Len; i+=N) {
        __m256i vNH = vNegInf0;
        __m256i vWH = vNegInf0;
        __m256i vE = vNegInf;
        __m256i vF = vNegInf;
        __m256i vJ = vJreset;
        const int * const restrict matrow0 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+0] : ((i+0 >= s1Len) ? s1Len-1 : i+0))];
        const int * const restrict matrow1 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+1] : ((i+1 >= s1Len) ? s1Len-1 : i+1))];
        const int * const restrict matrow2 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+2] : ((i+2 >= s1Len) ? s1Len-1 : i+2))];
        const int * const restrict matrow3 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+3] : ((i+3 >= s1Len) ? s1Len-1 : i+3))];
        const int * const restrict matrow4 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+4] : ((i+4 >= s1Len) ? s1Len-1 : i+4))];
        const int * const restrict matrow5 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+5] : ((i+5 >= s1Len) ? s1Len-1 : i+5))];
        const int * const restrict matrow6 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+6] : ((i+6 >= s1Len) ? s1Len-1 : i+6))];
        const int * const restrict matrow7 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+7] : ((i+7 >= s1Len) ? s1Len-1 : i+7))];
        const int * const restrict matrow8 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+8] : ((i+8 >= s1Len) ? s1Len-1 : i+8))];
        const int * const restrict matrow9 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+9] : ((i+9 >= s1Len) ? s1Len-1 : i+9))];
        const int * const restrict matrow10 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+10] : ((i+10 >= s1Len) ? s1Len-1 : i+10))];
        const int * const restrict matrow11 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+11] : ((i+11 >= s1Len) ? s1Len-1 : i+11))];
        const int * const restrict matrow12 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+12] : ((i+12 >= s1Len) ? s1Len-1 : i+12))];
        const int * const restrict matrow13 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+13] : ((i+13 >= s1Len) ? s1Len-1 : i+13))];
        const int * const restrict matrow14 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+14] : ((i+14 >= s1Len) ? s1Len-1 : i+14))];
        const int * const restrict matrow15 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+15] : ((i+15 >= s1Len) ? s1Len-1 : i+15))];
        __m256i vIltLimit = _mm256_cmplt_epi16_rpl(vI, vILimit);
        /* iterate over database sequence */
        for (j=0; j<s2Len+PAD; ++j) {
            __m256i vMat;
            __m256i vNWH = vNH;
            vNH = _mm256_srli_si256_rpl(vWH, 2);
            vNH = _mm256_insert_epi16_rpl(vNH, H_pr[j], 15);
            vF = _mm256_srli_si256_rpl(vF, 2);
            vF = _mm256_insert_epi16_rpl(vF, F_pr[j], 15);
            vF = _mm256_max_epi16(
                    _mm256_subs_epi16(vNH, vOpen),
                    _mm256_subs_epi16(vF, vGap));
            vE = _mm256_max_epi16(
                    _mm256_subs_epi16(vWH, vOpen),
                    _mm256_subs_epi16(vE, vGap));
            vMat = _mm256_set_epi16(
                    matrow0[s2[j-0]],
                    matrow1[s2[j-1]],
                    matrow2[s2[j-2]],
                    matrow3[s2[j-3]],
                    matrow4[s2[j-4]],
                    matrow5[s2[j-5]],
                    matrow6[s2[j-6]],
                    matrow7[s2[j-7]],
                    matrow8[s2[j-8]],
                    matrow9[s2[j-9]],
                    matrow10[s2[j-10]],
                    matrow11[s2[j-11]],
                    matrow12[s2[j-12]],
                    matrow13[s2[j-13]],
                    matrow14[s2[j-14]],
                    matrow15[s2[j-15]]
                    );
            vNWH = _mm256_adds_epi16(vNWH, vMat);
            vWH = _mm256_max_epi16(vNWH, vE);
            vWH = _mm256_max_epi16(vWH, vF);
            vWH = _mm256_max_epi16(vWH, vZero);
            /* as minor diagonal vector passes across the j=-1 boundary,
             * assign the appropriate boundary conditions */
            {
                __m256i cond = _mm256_cmpeq_epi16(vJ,vNegOne);
                vWH = _mm256_andnot_si256(cond, vWH);
                vF = _mm256_blendv_epi8(vF, vNegInf, cond);
                vE = _mm256_blendv_epi8(vE, vNegInf, cond);
            }
            /* cannot start checking sat until after J clears boundary */
            if (j > PAD) {
                vSaturationCheckMin = _mm256_min_epi16(vSaturationCheckMin, vWH);
                vSaturationCheckMax = _mm256_max_epi16(vSaturationCheckMax, vWH);
            }
#ifdef PARASAIL_TABLE
            arr_store_si256(result->tables->score_table, vWH, i, s1Len, j, s2Len);
#endif
#ifdef PARASAIL_ROWCOL
            arr_store_rowcol(result->rowcols->score_row, result->rowcols->score_col, vWH, i, s1Len, j, s2Len);
#endif
            H_pr[j-15] = (int16_t)_mm256_extract_epi16_rpl(vWH,0);
            F_pr[j-15] = (int16_t)_mm256_extract_epi16_rpl(vF,0);
            /* as minor diagonal vector passes across table, extract
             * max values within the i,j bounds */
            {
                __m256i cond_valid_J = _mm256_and_si256(
                        _mm256_cmpgt_epi16(vJ, vNegOne),
                        _mm256_cmplt_epi16_rpl(vJ, vJLimit));
                __m256i cond_valid_IJ = _mm256_and_si256(cond_valid_J, vIltLimit);
                __m256i cond_eq = _mm256_cmpeq_epi16(vWH, vMaxH);
                __m256i cond_max = _mm256_cmpgt_epi16(vWH, vMaxH);
                __m256i cond_all = _mm256_and_si256(cond_max, cond_valid_IJ);
                __m256i cond_Jlt = _mm256_cmplt_epi16_rpl(vJ, vEndJ);
                vMaxH = _mm256_blendv_epi8(vMaxH, vWH, cond_all);
                vEndI = _mm256_blendv_epi8(vEndI, vI, cond_all);
                vEndJ = _mm256_blendv_epi8(vEndJ, vJ, cond_all);
                cond_all = _mm256_and_si256(cond_Jlt, cond_eq);
                cond_all = _mm256_and_si256(cond_all, cond_valid_IJ);
                vEndI = _mm256_blendv_epi8(vEndI, vI, cond_all);
                vEndJ = _mm256_blendv_epi8(vEndJ, vJ, cond_all);
            }
            vJ = _mm256_adds_epi16(vJ, vOne);
        }
        vI = _mm256_adds_epi16(vI, vN);
    }

    /* alignment ending position */
    {
        int16_t *t = (int16_t*)&vMaxH;
        int16_t *i = (int16_t*)&vEndI;
        int16_t *j = (int16_t*)&vEndJ;
        int32_t k;
        for (k=0; k<N; ++k, ++t, ++i, ++j) {
            if (*t > score) {
                score = *t;
                end_query = *i;
                end_ref = *j;
            }
            else if (*t == score) {
                if (*j < end_ref) {
                    end_query = *i;
                    end_ref = *j;
                }
                else if (*j == end_ref && *i < end_query) {
                    end_query = *i;
                    end_ref = *j;
                }
            }
        }
    }

    if (_mm256_movemask_epi8(_mm256_or_si256(
            _mm256_cmplt_epi16_rpl(vSaturationCheckMin, vNegLimit),
            _mm256_cmpgt_epi16(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(_F_pr);
    parasail_free(_H_pr);
    parasail_free(s2B);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        parasail_free(s1);
    }

    return result;
}